

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixderiv.h
# Opt level: O3

double __thiscall MixDerivs<double>::d2psi_dtau2(MixDerivs<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[0xd])();
  dVar1 = this->delta;
  dVar2 = this->R;
  dVar3 = this->Tr;
  dVar4 = this->tau;
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[5])(this->m_ders,2,0);
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[5])(this->m_ders,1,0);
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[5])(this->m_ders,0,0);
  return (extraout_XMM0_Qa_02 + extraout_XMM0_Qa_02 +
         (extraout_XMM0_Qa_00 - (extraout_XMM0_Qa_01 + extraout_XMM0_Qa_01))) *
         ((extraout_XMM0_Qa * dVar1 * dVar2 * dVar3) / (dVar4 * dVar4 * dVar4));
}

Assistant:

TYPE d2psi_dtau2() const {
        return (m_ders.rhor()*delta*R*Tr / (tau*tau*tau))*(A(2, 0) - 2.0*A(1, 0) + 2*A(0, 0));
    }